

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<bool>::insert
          (QPodArrayOps<bool> *this,qsizetype i,qsizetype n,parameter_type t)

{
  bool *__s;
  bool bVar1;
  
  bVar1 = i == 0 && (this->super_QArrayDataPointer<bool>).size != 0;
  QArrayDataPointer<bool>::detachAndGrow
            (&this->super_QArrayDataPointer<bool>,(uint)bVar1,n,(bool **)0x0,
             (QArrayDataPointer<bool> *)0x0);
  __s = createHole(this,(uint)bVar1,i,n);
  if (n != 0) {
    memset(__s,(uint)t,n);
    return;
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }